

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O2

void * vinlet_new(t_symbol *s)

{
  t_object *owner;
  _glist *x;
  _inlet *p_Var1;
  
  owner = (t_object *)pd_new(vinlet_class);
  x = canvas_getcurrent();
  owner[1].te_g.g_pd = (t_pd)x;
  p_Var1 = canvas_addinlet(x,(t_pd *)owner,(t_symbol *)0x0);
  owner[1].te_g.g_next = (_gobj *)p_Var1;
  *(undefined4 *)&owner[1].te_binbuf = 0;
  owner[1].te_outlet = (_outlet *)0x0;
  outlet_new(owner,(t_symbol *)0x0);
  return owner;
}

Assistant:

static void *vinlet_new(t_symbol *s)
{
    t_vinlet *x = (t_vinlet *)pd_new(vinlet_class);
    x->x_canvas = canvas_getcurrent();
    x->x_inlet = canvas_addinlet(x->x_canvas, &x->x_obj.ob_pd, 0);
    x->x_bufsize = 0;
    x->x_buf = 0;
    outlet_new(&x->x_obj, 0);
    return (x);
}